

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3rbu * rbuMisuseError(void)

{
  sqlite3rbu *__s;
  
  __s = (sqlite3rbu *)sqlite3_malloc64(0x170);
  if (__s != (sqlite3rbu *)0x0) {
    memset(__s,0,0x170);
    __s->rc = 0x15;
  }
  return __s;
}

Assistant:

static sqlite3rbu *rbuMisuseError(void){
  sqlite3rbu *pRet;
  pRet = sqlite3_malloc64(sizeof(sqlite3rbu));
  if( pRet ){
    memset(pRet, 0, sizeof(sqlite3rbu));
    pRet->rc = SQLITE_MISUSE;
  }
  return pRet;
}